

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O1

InlinedFrame * __thiscall
Js::InlinedFrameWalker::GetFrameAtIndex(InlinedFrameWalker *this,int index)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  InlinedFrame *pIVar4;
  
  if (this->frames == (InlinedFrame **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x5d7,"(frames)","frames");
    if (!bVar2) goto LAB_00afc9cb;
    *puVar3 = 0;
  }
  if (this->frameCount == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x5d8,"(frameCount)","frameCount");
    if (!bVar2) {
LAB_00afc9cb:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (index < this->frameCount) {
    pIVar4 = this->frames[index];
  }
  else {
    pIVar4 = (InlinedFrame *)0x0;
  }
  return pIVar4;
}

Assistant:

InlinedFrameWalker::InlinedFrame *InlinedFrameWalker::GetFrameAtIndex(signed index) const
    {
        Assert(frames);
        Assert(frameCount);

        InlinedFrameWalker::InlinedFrame *frame = nullptr;
        if (index < frameCount)
        {
            frame = frames[index];
        }

        return frame;
    }